

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  long lVar1;
  value_ptr<int,_nonstd::vptr::detail::default_clone<int>,_nonstd::vptr::detail::default_delete<int>_>
  *in_RDX;
  string local_80 [32];
  string local_60;
  undefined1 local_40 [40];
  
  lVar1 = *(long *)*(lest **)this;
  to_string<nonstd::vptr::value_ptr<int,nonstd::vptr::detail::default_clone<int>,nonstd::vptr::detail::default_delete<int>>>
            (&local_60,*(lest **)this,in_RDX);
  std::__cxx11::string::string(local_80,(string *)&local_60);
  local_40[0] = lVar1 != 0;
  std::__cxx11::string::string((string *)(local_40 + 8),local_80);
  result::result(__return_storage_ptr__,(result *)local_40);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result( !!lhs, to_string( lhs ) ); }